

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.hpp
# Opt level: O3

bool __thiscall
tokenizer::as(tokenizer *this,list<expected_token,_std::allocator<expected_token>_> *rhs)

{
  char *__s1;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  reference prVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _List_node_base *p_Var7;
  int iVar8;
  undefined1 local_3e8 [8];
  cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  lexer;
  pointer local_88;
  char *first;
  char *last;
  iterator_type end;
  string rest;
  undefined1 local_40 [8];
  iterator_type iter;
  
  local_88 = (this->text)._M_dataplus._M_p;
  first = local_88 + (this->text)._M_string_length;
  rest.field_2._8_8_ = this;
  cpp_properties::
  cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
  ::cpp_properties_lexer
            ((cpp_properties_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
              *)local_3e8);
  iVar8 = 0;
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
  ::begin((lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
           *)local_40,(char **)local_3e8,&local_88,(char_type *)&first);
  last = (char *)0x0;
  end.super_type.
  super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>::shared<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>_*,_0>
  .member = (shared<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
             *)0x0;
  p_Var7 = (_List_node_base *)rhs;
  while( true ) {
    p_Var7 = (((_List_base<expected_token,_std::allocator<expected_token>_> *)&p_Var7->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    bVar2 = boost::spirit::
            multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
            ::operator==((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                          *)local_40,
                         (multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                          *)&last);
    if (bVar2) break;
    prVar4 = boost::spirit::iterator_policies::split_std_deque::
             unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
             ::
             dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                       ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                         *)local_40);
    if ((0xfffffffffffffffd <
         (prVar4->
         super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
         ).
         super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
         .id_ - 1) || (p_Var7 == (_List_node_base *)rhs)) break;
    prVar4 = boost::spirit::iterator_policies::split_std_deque::
             unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
             ::
             dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                       ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                         *)local_40);
    if ((_List_node_base *)
        (prVar4->
        super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
        ).
        super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
        .id_ != p_Var7[1]._M_next) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"state: ",7);
      boost::spirit::iterator_policies::split_std_deque::
      unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
      ::
      dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                  *)local_40);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"id: expected=",0xd);
      this_00 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(rest.field_2._8_8_ + 0x20);
      end.super_type.
      super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
      .
      super_multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
      .
      super_unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>
      .queued_position._0_4_ = *(undefined4 *)&p_Var7[1]._M_next;
      pmVar6 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)
                                    &end.super_type.
                                     super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
                           );
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", actual=",9);
      prVar4 = boost::spirit::iterator_policies::split_std_deque::
               unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
               ::
               dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                         ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                           *)local_40);
      lexer.
      super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
      .self.targetstate.field_2._12_4_ =
           (undefined4)
           (prVar4->
           super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
           ).
           super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
           .id_;
      pmVar6 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,(key_type *)
                                    (lexer.
                                     super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                                     .self.targetstate.field_2._M_local_buf + 0xc));
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"string:>",8);
      boost::spirit::iterator_policies::split_std_deque::
      unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
      ::
      dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                  *)local_40);
      poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<\n",2);
      goto LAB_001078b9;
    }
    prVar4 = boost::spirit::iterator_policies::split_std_deque::
             unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
             ::
             dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                       ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                         *)local_40);
    __s1 = (prVar4->value_).
           super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
           super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
           m_Begin;
    pcVar1 = (prVar4->value_).
             super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
             super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
             super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
             m_End;
    if ((_List_node_base *)(pcVar1 + -(long)__s1) != p_Var7[2]._M_next) {
LAB_001075f2:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"state: ",7);
      boost::spirit::iterator_policies::split_std_deque::
      unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
      ::
      dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                  *)local_40);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"id: ",4);
      prVar4 = boost::spirit::iterator_policies::split_std_deque::
               unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
               ::
               dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                         ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                           *)local_40);
      end.super_type.
      super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
      .
      super_multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
      .
      super_unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>
      .queued_position._0_4_ =
           (int)(prVar4->
                super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
                ).
                super_token<const_char_*,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
                .id_;
      pmVar6 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(rest.field_2._8_8_ + 0x20),
                            (key_type *)
                            &end.super_type.
                             super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
                           );
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"string: expected=>",0x12);
      boost::spirit::iterator_policies::split_std_deque::
      unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
      ::
      dereference<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
                ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                  *)local_40);
      poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<, actual=>",0xb);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)p_Var7[1]._M_prev,(long)p_Var7[2]._M_next);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<\n",2);
      goto LAB_001078b9;
    }
    if (pcVar1 != __s1) {
      iVar3 = bcmp(__s1,p_Var7[1]._M_prev,(size_t)p_Var7[2]._M_next);
      if (iVar3 != 0) goto LAB_001075f2;
    }
    boost::spirit::iterator_policies::split_std_deque::
    unique<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>>
    ::
    increment<boost::spirit::multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<char_const*,boost::mpl::vector0<mpl_::na>,mpl_::bool_<true>,unsigned_long>,boost::spirit::lex::lexertl::detail::data,char_const*,mpl_::bool_<true>,mpl_::bool_<true>>,boost::spirit::lex::lexertl::detail::data<char_const*,mpl_::bool_<true>,mpl_::bool_<true>,boost::iterator_range<char_const*>>>,boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,boost::spirit::iterator_policies::no_check,boost::spirit::iterator_policies::split_functor_input,boost::spirit::iterator_policies::split_std_deque>>>
              ((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                *)local_40);
    iVar8 = iVar8 + 1;
  }
  bVar2 = boost::spirit::
          multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
          ::operator==((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                        *)local_40,
                       (multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                        *)&last);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"*** Debug: ",0xb);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," token(s) found\n",0x10);
    if (p_Var7 == (_List_node_base *)rhs) {
      bVar2 = true;
      goto LAB_001078bb;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"missing expected tokens\n",0x18);
  }
  else {
    end.super_type.
    super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
    .
    super_multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
    .
    super_unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>
    .queued_position =
         (multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
          )(multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
            )&rest._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &end.super_type.
                super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
               ,local_88,first);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Lexical analysis failed\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stopped at: \"",0xd);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)end.super_type.
                                super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
                                .
                                super_multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
                                .
                                super_unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>
                                .queued_position,(long)rest._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
    if (end.super_type.
        super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
        .
        super_multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
        .
        super_unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>
        .queued_position !=
        (multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
         )&rest._M_string_length) {
      operator_delete((void *)end.super_type.
                              super_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>_>
                              .
                              super_multi_pass_unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::split_functor_input::unique<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_true>,_boost::spirit::iterator_policies::split_std_deque::unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>,_true,_true,_true>
                              .
                              super_unique<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>_>
                              .queued_position,rest._M_string_length + 1);
    }
  }
LAB_001078b9:
  bVar2 = false;
LAB_001078bb:
  boost::spirit::
  multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                 *)&last);
  boost::spirit::
  multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass((multi_pass<std::pair<boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>,_boost::spirit::lex::lexertl::detail::data<const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>,_boost::iterator_range<const_char_*>_>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::split_functor_input,_boost::spirit::iterator_policies::split_std_deque>_>
                 *)local_40);
  if ((size_type *)
      lexer.
      super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
      .self.state.field_2._8_8_ !=
      &lexer.
       super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
       .self.targetstate._M_string_length) {
    operator_delete((void *)lexer.
                            super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                            .self.state.field_2._8_8_,
                    lexer.
                    super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                    .self.targetstate._M_string_length + 1);
  }
  if (lexer.
      super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
      .self.def !=
      (lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
       *)&lexer.
          super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
          .self.state._M_string_length) {
    operator_delete(lexer.
                    super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                    .self.def,
                    lexer.
                    super_lexer<boost::spirit::lex::lexertl::actor_lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>_>
                    .self.state._M_string_length + 1);
  }
  boost::spirit::lex::lexertl::
  lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
  ::~lexer((lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<true>,_mpl_::bool_<true>_>_>
            *)local_3e8);
  return bVar2;
}

Assistant:

bool as(const list<value_type>& rhs) {
        char const* first = text.c_str();
        char const* last = &first[text.size()];

        cp::cpp_properties_lexer<lexer_type> lexer;
        lexer_type::iterator_type iter = lexer.begin(first, last);
        lexer_type::iterator_type end = lexer.end();

        list<value_type>::const_iterator citer_expected = rhs.cbegin();
        list<value_type>::const_iterator cend_expected = rhs.cend();

        int i = 0;
        while (iter != end && token_is_valid(*iter) && citer_expected != cend_expected) {
            if (iter->id() != citer_expected->id) {
                std::cout << "state: " << iter->state() << ", "
                            << "id: expected=" << name[citer_expected->id] << ", actual=" << name[iter->id()] << ", "
                          << "string:>" << iter->value() << "<\n";
                return false;
            }
            if (iter->value() != citer_expected->value) {
            std::cout << "state: " << iter->state() << ", "
                      << "id: " << name[iter->id()] << ", "
                      << "string: expected=>" << iter->value() << "<, actual=>" << citer_expected->value << "<\n";
                return false;
            }
            ++i;
            ++iter;
            ++citer_expected;
        }
        if (iter == end) {
            std::cout << "*** Debug: " << i << " token(s) found\n";
            if (citer_expected != cend_expected) {
                std::cout << "missing expected tokens\n";
                return false;
            } else {
                return true;
            }
        } else {
            std::string rest(first, last);
            std::cout << "Lexical analysis failed\n" << "stopped at: \""
                      << rest << "\"\n";
        }
        return false;
    }